

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O2

uint __thiscall
llvm::DWARFVerifier::verifyUnitSection
          (DWARFVerifier *this,DWARFSection *S,DWARFSectionKind SectionKind)

{
  DWARFObject *pDVar1;
  ulong uVar2;
  DWARFContext *pDVar3;
  DWARFDataExtractor DebugInfoData_00;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  DWARFUnit *Unit;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  raw_ostream *this_00;
  byte bVar9;
  long lVar10;
  bool bVar11;
  undefined1 local_1b8 [8];
  DWARFUnitVector TypeUnitVector;
  DWARFUnitVector CompileUnitVector;
  DWARFUnitHeader Header;
  DWARFDataExtractor DebugInfoData;
  uint64_t local_b8;
  uint64_t OffsetStart;
  long local_a0;
  DWARFUnitHeader *local_98;
  DWARFSectionKind local_8c;
  uint64_t local_88;
  uint64_t Offset;
  DWARFSection *local_78;
  undefined1 local_70 [20];
  undefined4 local_5c;
  _Head_base<0UL,_llvm::DWARFUnit_*,_false> local_58;
  _Head_base<0UL,_llvm::DWARFUnit_*,_false> local_50;
  int local_44;
  undefined1 local_40 [13];
  bool local_33;
  bool local_32;
  undefined1 local_31 [5];
  uint8_t UnitType;
  bool isUnitDWARF64;
  
  pDVar1 = (this->DCtx->DObj)._M_t.
           super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
           .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
  local_8c = SectionKind;
  iVar4 = (*pDVar1->_vptr_DWARFObject[5])(pDVar1);
  Header._72_8_ = (S->Data).Data;
  uVar2 = (S->Data).Length;
  local_b8 = 0;
  local_88 = 0;
  local_40[0xc] = 0;
  bVar11 = uVar2 != 0;
  local_1b8 = (undefined1  [8])
              &TypeUnitVector.
               super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
               .
               super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
               .
               super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
               .
               super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
               .super_SmallVectorBase.Size;
  TypeUnitVector.
  super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>.
  super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>.
  super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
  .
  super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
  .super_SmallVectorBase.BeginX = (void *)0x100000000;
  TypeUnitVector.
  super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>.
  super_SmallVectorStorage<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
  .InlineElts[0].buffer =
       (AlignedCharArrayUnion<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
         [1])(AlignedCharArrayUnion<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
              )0x0;
  TypeUnitVector.Parser.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  TypeUnitVector.Parser.super__Function_base._M_functor._8_8_ = 0;
  TypeUnitVector.Parser.super__Function_base._M_manager = (_Manager_type)0x0;
  TypeUnitVector.Parser._M_invoker._0_4_ = 0xffffffff;
  TypeUnitVector._56_8_ =
       &CompileUnitVector.
        super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
        .
        super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
        .
        super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
        .
        super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
        .super_SmallVectorBase.Size;
  CompileUnitVector.
  super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>.
  super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>.
  super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
  .
  super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
  .super_SmallVectorBase.BeginX = (void *)0x100000000;
  CompileUnitVector.
  super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>.
  super_SmallVectorStorage<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
  .InlineElts[0].buffer =
       (AlignedCharArrayUnion<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
         [1])(AlignedCharArrayUnion<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
              )0x0;
  CompileUnitVector.Parser.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  CompileUnitVector.Parser.super__Function_base._M_functor._8_8_ = 0;
  CompileUnitVector.Parser.super__Function_base._M_manager = (_Manager_type)0x0;
  CompileUnitVector.Parser._M_invoker._0_4_ = 0xffffffff;
  local_33 = false;
  local_5c = (undefined4)CONCAT71((int7)((ulong)&local_33 >> 8),1);
  local_44 = 0;
  lVar10 = 0;
  local_98 = (DWARFUnitHeader *)S;
  do {
    iVar5 = local_44;
    if (!bVar11) {
      bVar9 = (byte)local_5c;
      if (lVar10 == 0) {
        this_00 = warn(this);
        bVar9 = 1;
        raw_ostream::operator<<(this_00,"Section is empty.\n");
      }
LAB_00b4c3eb:
      uVar8 = verifyDebugInfoReferences(this);
      DWARFUnitVector::~DWARFUnitVector((DWARFUnitVector *)&TypeUnitVector.NumInfoUnits);
      DWARFUnitVector::~DWARFUnitVector((DWARFUnitVector *)local_1b8);
      return uVar8 + iVar5 + (uint)(~bVar9 & 1);
    }
    DebugInfoData_00.super_DataExtractor.AddressSize = '\0';
    DebugInfoData_00.super_DataExtractor.IsLittleEndian = (byte)iVar4;
    DebugInfoData_00.super_DataExtractor._18_6_ =
         DebugInfoData.super_DataExtractor.Data.Length._2_6_;
    DebugInfoData_00.super_DataExtractor.Data.Length = uVar2;
    DebugInfoData_00.super_DataExtractor.Data.Data = (char *)Header._72_8_;
    DebugInfoData_00.Obj = pDVar1;
    DebugInfoData_00.Section = S;
    local_b8 = local_88;
    bVar11 = verifyUnitHeader(this,DebugInfoData_00,&local_88,(uint)lVar10,local_40 + 0xc,&local_33)
    ;
    if (bVar11) {
      CompileUnitVector.NumInfoUnits = 0;
      CompileUnitVector._60_4_ = 0;
      Header.DWOId.Storage.field_0.empty = '\0';
      Header.DWOId.Storage.hasVal = false;
      Header.DWOId.Storage._9_1_ = 0;
      Header.TypeHash._0_1_ = 0;
      Header._41_8_ = 0;
      Header.AbbrOffset = 0;
      Header.IndexEntry._0_1_ = 0;
      Header.IndexEntry._1_7_ = 0;
      Header.FormParams.Version = 0;
      Header.FormParams.AddrSize = '\0';
      Header.FormParams.Format = DWARF32;
      Header._12_4_ = 0;
      Header.Length = 0;
      DWARFUnitHeader::extract
                ((DWARFUnitHeader *)&CompileUnitVector.NumInfoUnits,this->DCtx,
                 (DWARFDataExtractor *)&Header.UnitType,&local_b8,local_8c,(DWARFUnitIndex *)0x0,
                 (Entry *)0x0);
      if (6 < local_40[0xc]) {
        llvm_unreachable_internal
                  ("Invalid UnitType.",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFVerifier.cpp"
                   ,0x141);
      }
      local_a0 = lVar10;
      if ((0x3bU >> (local_40[0xc] & 0x1f) & 1) == 0) {
        pDVar3 = this->DCtx;
        Offset = (uint64_t)DWARFContext::getDebugAbbrev(pDVar3);
        iVar5 = (*pDVar1->_vptr_DWARFObject[0x12])(pDVar1);
        local_78 = (DWARFSection *)CONCAT44(extraout_var_05,iVar5);
        iVar5 = (*pDVar1->_vptr_DWARFObject[10])(pDVar1);
        local_70._0_8_ = CONCAT44(extraout_var_06,iVar5);
        iVar5 = (*pDVar1->_vptr_DWARFObject[0x11])(pDVar1);
        OffsetStart = CONCAT44(extraout_var_07,iVar5);
        iVar5 = (*pDVar1->_vptr_DWARFObject[0x19])(pDVar1);
        iVar6 = (*pDVar1->_vptr_DWARFObject[0x28])(pDVar1);
        local_70._8_8_ = CONCAT44(extraout_var_09,iVar6);
        iVar6 = (*pDVar1->_vptr_DWARFObject[0xf])(pDVar1);
        iVar7 = (*((this->DCtx->DObj)._M_t.
                   super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                   .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
                  _vptr_DWARFObject[5])();
        local_32 = SUB41(iVar7,0);
        local_31[0] = 0;
        std::
        make_unique<llvm::DWARFTypeUnit,llvm::DWARFContext&,llvm::DWARFSection_const&,llvm::DWARFUnitHeader&,llvm::DWARFDebugAbbrev_const*,llvm::DWARFSection_const*,llvm::DWARFSection_const*,llvm::StringRef,llvm::DWARFSection_const&,llvm::DWARFSection_const*,llvm::DWARFSection_const&,bool,bool,llvm::DWARFUnitVector&>
                  ((DWARFContext *)local_40,(DWARFSection *)pDVar3,local_98,
                   (DWARFDebugAbbrev **)&CompileUnitVector.NumInfoUnits,(DWARFSection **)&Offset,
                   &local_78,(StringRef *)local_70,(DWARFSection *)&OffsetStart,
                   (DWARFSection **)CONCAT44(extraout_var_08,iVar5),(DWARFSection *)(local_70 + 8),
                   (bool *)CONCAT44(extraout_var_10,iVar6),&local_32,(DWARFUnitVector *)local_31);
        local_58._M_head_impl = (DWARFUnit *)local_40._0_8_;
        local_40._0_8_ = (DWARFUnit *)0x0;
        Unit = DWARFUnitVector::addUnit
                         ((DWARFUnitVector *)local_1b8,
                          (unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *)
                          &local_58);
        lVar10 = local_a0;
        if (local_58._M_head_impl != (DWARFUnit *)0x0) {
          (*(local_58._M_head_impl)->_vptr_DWARFUnit[1])();
        }
        local_58._M_head_impl = (DWARFUnit *)0x0;
      }
      else {
        pDVar3 = this->DCtx;
        Offset = (uint64_t)DWARFContext::getDebugAbbrev(pDVar3);
        iVar5 = (*pDVar1->_vptr_DWARFObject[0x12])(pDVar1);
        local_78 = (DWARFSection *)CONCAT44(extraout_var,iVar5);
        iVar5 = (*pDVar1->_vptr_DWARFObject[10])(pDVar1);
        local_70._0_8_ = CONCAT44(extraout_var_00,iVar5);
        iVar5 = (*pDVar1->_vptr_DWARFObject[0x11])(pDVar1);
        OffsetStart = CONCAT44(extraout_var_01,iVar5);
        iVar5 = (*pDVar1->_vptr_DWARFObject[0x19])(pDVar1);
        iVar6 = (*pDVar1->_vptr_DWARFObject[0x28])(pDVar1);
        local_70._8_8_ = CONCAT44(extraout_var_03,iVar6);
        iVar6 = (*pDVar1->_vptr_DWARFObject[0xf])(pDVar1);
        iVar7 = (*((this->DCtx->DObj)._M_t.
                   super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                   .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
                  _vptr_DWARFObject[5])();
        local_32 = SUB41(iVar7,0);
        local_31[0] = 0;
        std::
        make_unique<llvm::DWARFCompileUnit,llvm::DWARFContext&,llvm::DWARFSection_const&,llvm::DWARFUnitHeader&,llvm::DWARFDebugAbbrev_const*,llvm::DWARFSection_const*,llvm::DWARFSection_const*,llvm::StringRef,llvm::DWARFSection_const&,llvm::DWARFSection_const*,llvm::DWARFSection_const&,bool,bool,llvm::DWARFUnitVector&>
                  ((DWARFContext *)local_40,(DWARFSection *)pDVar3,local_98,
                   (DWARFDebugAbbrev **)&CompileUnitVector.NumInfoUnits,(DWARFSection **)&Offset,
                   &local_78,(StringRef *)local_70,(DWARFSection *)&OffsetStart,
                   (DWARFSection **)CONCAT44(extraout_var_02,iVar5),(DWARFSection *)(local_70 + 8),
                   (bool *)CONCAT44(extraout_var_04,iVar6),&local_32,(DWARFUnitVector *)local_31);
        local_50._M_head_impl = (DWARFUnit *)local_40._0_8_;
        local_40._0_8_ = (DWARFUnit *)0x0;
        Unit = DWARFUnitVector::addUnit
                         ((DWARFUnitVector *)&TypeUnitVector.NumInfoUnits,
                          (unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *)
                          &local_50);
        lVar10 = local_a0;
        if (local_50._M_head_impl != (DWARFUnit *)0x0) {
          (*(local_50._M_head_impl)->_vptr_DWARFUnit[1])();
        }
        local_50._M_head_impl = (DWARFUnit *)0x0;
      }
      if ((DWARFUnit *)local_40._0_8_ != (DWARFUnit *)0x0) {
        (*(*(_func_int ***)local_40._0_8_)[1])();
      }
      uVar8 = verifyUnitContents(this,Unit);
      local_44 = local_44 + uVar8;
    }
    else {
      local_5c = 0;
      if (local_33 != false) {
        bVar9 = 0;
        iVar5 = local_44;
        goto LAB_00b4c3eb;
      }
    }
    bVar11 = local_88 < uVar2;
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

unsigned DWARFVerifier::verifyUnitSection(const DWARFSection &S,
                                          DWARFSectionKind SectionKind) {
  const DWARFObject &DObj = DCtx.getDWARFObj();
  DWARFDataExtractor DebugInfoData(DObj, S, DCtx.isLittleEndian(), 0);
  unsigned NumDebugInfoErrors = 0;
  uint64_t OffsetStart = 0, Offset = 0, UnitIdx = 0;
  uint8_t UnitType = 0;
  bool isUnitDWARF64 = false;
  bool isHeaderChainValid = true;
  bool hasDIE = DebugInfoData.isValidOffset(Offset);
  DWARFUnitVector TypeUnitVector;
  DWARFUnitVector CompileUnitVector;
  while (hasDIE) {
    OffsetStart = Offset;
    if (!verifyUnitHeader(DebugInfoData, &Offset, UnitIdx, UnitType,
                          isUnitDWARF64)) {
      isHeaderChainValid = false;
      if (isUnitDWARF64)
        break;
    } else {
      DWARFUnitHeader Header;
      Header.extract(DCtx, DebugInfoData, &OffsetStart, SectionKind);
      DWARFUnit *Unit;
      switch (UnitType) {
      case dwarf::DW_UT_type:
      case dwarf::DW_UT_split_type: {
        Unit = TypeUnitVector.addUnit(std::make_unique<DWARFTypeUnit>(
            DCtx, S, Header, DCtx.getDebugAbbrev(), &DObj.getRangesSection(),
            &DObj.getLocSection(), DObj.getStrSection(),
            DObj.getStrOffsetsSection(), &DObj.getAppleObjCSection(),
            DObj.getLineSection(), DCtx.isLittleEndian(), false,
            TypeUnitVector));
        break;
      }
      case dwarf::DW_UT_skeleton:
      case dwarf::DW_UT_split_compile:
      case dwarf::DW_UT_compile:
      case dwarf::DW_UT_partial:
      // UnitType = 0 means that we are verifying a compile unit in DWARF v4.
      case 0: {
        Unit = CompileUnitVector.addUnit(std::make_unique<DWARFCompileUnit>(
            DCtx, S, Header, DCtx.getDebugAbbrev(), &DObj.getRangesSection(),
            &DObj.getLocSection(), DObj.getStrSection(),
            DObj.getStrOffsetsSection(), &DObj.getAppleObjCSection(),
            DObj.getLineSection(), DCtx.isLittleEndian(), false,
            CompileUnitVector));
        break;
      }
      default: { llvm_unreachable("Invalid UnitType."); }
      }
      NumDebugInfoErrors += verifyUnitContents(*Unit);
    }
    hasDIE = DebugInfoData.isValidOffset(Offset);
    ++UnitIdx;
  }
  if (UnitIdx == 0 && !hasDIE) {
    warn() << "Section is empty.\n";
    isHeaderChainValid = true;
  }
  if (!isHeaderChainValid)
    ++NumDebugInfoErrors;
  NumDebugInfoErrors += verifyDebugInfoReferences();
  return NumDebugInfoErrors;
}